

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetAccessors
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *getter,Var *setter)

{
  BOOL BVar1;
  ES5Array *arr;
  uint32 local_44;
  ScriptContext *pSStack_40;
  uint32 index;
  ScriptContext *scriptContext;
  Var *setter_local;
  Var *getter_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext = (ScriptContext *)setter;
  setter_local = getter;
  getter_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSStack_40 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_40,getter_local._4_4_,&local_44);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<int>::GetAccessors
                   (&this->super_DictionaryTypeHandlerBase<int>,pDStack_20,getter_local._4_4_,
                    setter_local,(Var *)scriptContext);
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(pDStack_20);
    this_local._4_4_ =
         GetItemAccessors(this,arr,pDStack_20,local_44,setter_local,(Var *)scriptContext);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetItemAccessors(VarTo<ES5Array>(instance), instance, index, getter, setter);
        }

        return __super::GetAccessors(instance, propertyId, getter, setter);
    }